

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O1

int WebPPictureView(WebPPicture *src,int left,int top,int width,int height,WebPPicture *dst)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint32_t *puVar5;
  int local_30;
  int local_2c;
  
  if (dst == (WebPPicture *)0x0 || src == (WebPPicture *)0x0) {
    return 0;
  }
  local_30 = top;
  local_2c = left;
  iVar2 = AdjustAndCheckRectangle(src,&local_2c,&local_30,width,height);
  if (iVar2 != 0) {
    if (src != dst) {
      memcpy(dst,src,0x100);
      WebPPictureResetBuffers(dst);
    }
    dst->width = width;
    dst->height = height;
    lVar3 = (long)local_2c;
    if (src->use_argb == 0) {
      iVar2 = src->y_stride;
      dst->y = src->y + lVar3 + iVar2 * local_30;
      iVar1 = src->uv_stride;
      lVar4 = (long)((local_30 >> 1) * iVar1);
      dst->u = src->u + (local_2c >> 1) + lVar4;
      dst->v = src->v + (local_2c >> 1) + lVar4;
      dst->y_stride = iVar2;
      dst->uv_stride = iVar1;
      if (src->a == (uint8_t *)0x0) {
        return 1;
      }
      iVar2 = src->a_stride;
      puVar5 = (uint32_t *)(src->a + local_30 * iVar2 + lVar3);
      lVar3 = 0x38;
      lVar4 = 0x30;
    }
    else {
      iVar2 = src->argb_stride;
      puVar5 = src->argb + local_30 * iVar2 + lVar3;
      lVar3 = 0x50;
      lVar4 = 0x48;
    }
    *(uint32_t **)((long)dst->pad1 + lVar4 + -0x3c) = puVar5;
    *(int *)((long)dst->pad1 + lVar3 + -0x3c) = iVar2;
    return 1;
  }
  return 0;
}

Assistant:

int WebPPictureView(const WebPPicture* src,
                    int left, int top, int width, int height,
                    WebPPicture* dst) {
  if (src == NULL || dst == NULL) return 0;

  // verify rectangle position.
  if (!AdjustAndCheckRectangle(src, &left, &top, width, height)) return 0;

  if (src != dst) {  // beware of aliasing! We don't want to leak 'memory_'.
    PictureGrabSpecs(src, dst);
  }
  dst->width = width;
  dst->height = height;
  if (!src->use_argb) {
    dst->y = src->y + top * src->y_stride + left;
    dst->u = src->u + (top >> 1) * src->uv_stride + (left >> 1);
    dst->v = src->v + (top >> 1) * src->uv_stride + (left >> 1);
    dst->y_stride = src->y_stride;
    dst->uv_stride = src->uv_stride;
    if (src->a != NULL) {
      dst->a = src->a + top * src->a_stride + left;
      dst->a_stride = src->a_stride;
    }
  } else {
    dst->argb = src->argb + top * src->argb_stride + left;
    dst->argb_stride = src->argb_stride;
  }
  return 1;
}